

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<QModelIndex,QSortFilterProxyModelPrivate::Mapping*>>::
emplace<QModelIndex&,QSortFilterProxyModelPrivate::Mapping*&>
          (QMovableArrayOps<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_> *this,
          qsizetype i,QModelIndex *args,Mapping **args_1)

{
  bool bVar1;
  qsizetype qVar2;
  pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*> *ppVar3;
  Mapping **in_RCX;
  QModelIndex *in_RDX;
  pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*> *in_RSI;
  Inserter *in_RDI;
  long in_FS_OFFSET;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*> tmp;
  pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*> *in_stack_ffffffffffffff58;
  QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>
  *in_stack_ffffffffffffff60;
  Inserter *this_00;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  undefined1 uVar4;
  GrowthPosition in_stack_ffffffffffffff7c;
  QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>
  *in_stack_ffffffffffffff80;
  Inserter local_50;
  undefined1 *local_28;
  undefined1 *local_20;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_18;
  Mapping *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>::
          needsDetach(in_stack_ffffffffffffff60);
  if (!bVar1) {
    if ((in_RSI == in_RDI->displaceTo) &&
       (qVar2 = QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>
                ::freeSpaceAtEnd((QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>
                                  *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68)),
       qVar2 != 0)) {
      ppVar3 = QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>::
               end(in_stack_ffffffffffffff60);
      std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>::
      pair<QModelIndex_&,_QSortFilterProxyModelPrivate::Mapping_*&,_true>(ppVar3,in_RDX,in_RCX);
      in_RDI->displaceTo =
           (pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*> *)
           ((long)&(in_RDI->displaceTo->first).r + 1);
      goto LAB_008a9719;
    }
    if ((in_RSI == (pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*> *)0x0) &&
       (qVar2 = QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>
                ::freeSpaceAtBegin((QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>
                                    *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68))
       , qVar2 != 0)) {
      ppVar3 = QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>::
               begin((QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>
                      *)0x8a9574);
      std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>::
      pair<QModelIndex_&,_QSortFilterProxyModelPrivate::Mapping_*&,_true>(ppVar3 + -1,in_RDX,in_RCX)
      ;
      in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
      in_RDI->displaceTo =
           (pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*> *)
           ((long)&(in_RDI->displaceTo->first).r + 1);
      goto LAB_008a9719;
    }
  }
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = (Mapping *)&DAT_aaaaaaaaaaaaaaaa;
  std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>::
  pair<QModelIndex_&,_QSortFilterProxyModelPrivate::Mapping_*&,_true>
            ((pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*> *)&local_28,in_RDX,in_RCX);
  bVar1 = in_RDI->displaceTo != (pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*> *)0x0;
  uVar4 = bVar1 && in_RSI == (pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*> *)0x0;
  QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>::detachAndGrow
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,(qsizetype)in_RDI,
             (pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*> **)
             CONCAT17(uVar4,in_stack_ffffffffffffff68),in_stack_ffffffffffffff60);
  if (bVar1 && in_RSI == (pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*> *)0x0) {
    ppVar3 = QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>::
             begin((QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>
                    *)0x8a966b);
    *(undefined1 **)&ppVar3[-1].first = local_28;
    ppVar3[-1].first.i = (quintptr)local_20;
    ppVar3[-1].first.m.ptr = local_18.ptr;
    ppVar3[-1].second = local_10;
    in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
    in_RDI->displaceTo =
         (pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*> *)
         ((long)&(in_RDI->displaceTo->first).r + 1);
  }
  else {
    this_00 = &local_50;
    QMovableArrayOps<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>::Inserter::
    Inserter(in_RDI,(QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>
                     *)CONCAT17(uVar4,in_stack_ffffffffffffff68),(qsizetype)this_00,
             (qsizetype)in_stack_ffffffffffffff58);
    QMovableArrayOps<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>::Inserter::
    insertOne(this_00,in_stack_ffffffffffffff58);
    QMovableArrayOps<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>::Inserter::
    ~Inserter(&local_50);
  }
LAB_008a9719:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }